

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

int __thiscall glcts::ComputeShaderTests::init(ComputeShaderTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestSubcase *pTVar1;
  
  context = (this->super_TestCaseGroup).m_context;
  glcts::(anonymous_namespace)::currentLog = context->m_testCtx->m_log;
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,context,"simple-compute",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::SimpleCompute>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"one-work-group",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicOneWorkGroup>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resource-ubo",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicResourceUBO>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resource-texture",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicResourceTexture>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resource-image",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicResourceImage>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resource-atomic-counter",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicResourceAtomicCounter>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resource-uniform",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicResourceUniform>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"built-in-variables",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicBuiltinVariables>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"max",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicMax>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"work-group-size",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicWorkGroupSizeIsConst>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"build-separable",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicBuildSeparable>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"shared-simple",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicSharedSimple>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"shared-struct",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicSharedStruct>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"dispatch-indirect",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicDispatchIndirect>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"sso-compute-pipeline",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicSSOComputePipeline>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"sso-case2",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicSSOCase2>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"sso-case3",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicSSOCase3>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"atomic-case1",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicAtomicCase1>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"atomic-case2",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicAtomicCase2>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"atomic-case3",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::BasicAtomicCase3>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"copy-image",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedCopyImage>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"pipeline-pre-vs",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedPipelinePreVS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"pipeline-gen-draw-commands",
             deqp::TestSubcase::
             Create<glcts::(anonymous_namespace)::AdvancedPipelineGenDrawCommands>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"pipeline-compute-chain",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedPipelineComputeChain>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"pipeline-post-fs",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedPipelinePostFS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"pipeline-post-xfb",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedPipelinePostXFB>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"shared-indexing",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedSharedIndexing>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"shared-max",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedSharedMax>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"resources-max",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::AdvancedResourcesMax>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"api-no-active-program",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::NegativeAPINoActiveProgram>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"api-work-group-count",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::NegativeAPIWorkGroupCount>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"api-indirect",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::NegativeAPIIndirect>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"api-program",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::NegativeAPIProgram>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"glsl-compile-time-errors",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::NegativeGLSLCompileTimeErrors>)
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"glsl-link-time-errors",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::NegativeGLSLLinkTimeErrors>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"api-attach-shader",
             deqp::TestSubcase::Create<glcts::(anonymous_namespace)::NegativeAttachShader>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void ComputeShaderTests::init()
{
	using namespace glcts;
	setOutput(m_context.getTestContext().getLog());
	addChild(new TestSubcase(m_context, "simple-compute", TestSubcase::Create<SimpleCompute>));
	addChild(new TestSubcase(m_context, "one-work-group", TestSubcase::Create<BasicOneWorkGroup>));
	addChild(new TestSubcase(m_context, "resource-ubo", TestSubcase::Create<BasicResourceUBO>));
	addChild(new TestSubcase(m_context, "resource-texture", TestSubcase::Create<BasicResourceTexture>));
	addChild(new TestSubcase(m_context, "resource-image", TestSubcase::Create<BasicResourceImage>));
	addChild(new TestSubcase(m_context, "resource-atomic-counter", TestSubcase::Create<BasicResourceAtomicCounter>));
	addChild(new TestSubcase(m_context, "resource-uniform", TestSubcase::Create<BasicResourceUniform>));
	addChild(new TestSubcase(m_context, "built-in-variables", TestSubcase::Create<BasicBuiltinVariables>));
	addChild(new TestSubcase(m_context, "max", TestSubcase::Create<BasicMax>));
	addChild(new TestSubcase(m_context, "work-group-size", TestSubcase::Create<BasicWorkGroupSizeIsConst>));
	addChild(new TestSubcase(m_context, "build-separable", TestSubcase::Create<BasicBuildSeparable>));
	addChild(new TestSubcase(m_context, "shared-simple", TestSubcase::Create<BasicSharedSimple>));
	addChild(new TestSubcase(m_context, "shared-struct", TestSubcase::Create<BasicSharedStruct>));
	addChild(new TestSubcase(m_context, "dispatch-indirect", TestSubcase::Create<BasicDispatchIndirect>));
	addChild(new TestSubcase(m_context, "sso-compute-pipeline", TestSubcase::Create<BasicSSOComputePipeline>));
	addChild(new TestSubcase(m_context, "sso-case2", TestSubcase::Create<BasicSSOCase2>));
	addChild(new TestSubcase(m_context, "sso-case3", TestSubcase::Create<BasicSSOCase3>));
	addChild(new TestSubcase(m_context, "atomic-case1", TestSubcase::Create<BasicAtomicCase1>));
	addChild(new TestSubcase(m_context, "atomic-case2", TestSubcase::Create<BasicAtomicCase2>));
	addChild(new TestSubcase(m_context, "atomic-case3", TestSubcase::Create<BasicAtomicCase3>));
	addChild(new TestSubcase(m_context, "copy-image", TestSubcase::Create<AdvancedCopyImage>));
	addChild(new TestSubcase(m_context, "pipeline-pre-vs", TestSubcase::Create<AdvancedPipelinePreVS>));
	addChild(
		new TestSubcase(m_context, "pipeline-gen-draw-commands", TestSubcase::Create<AdvancedPipelineGenDrawCommands>));
	addChild(new TestSubcase(m_context, "pipeline-compute-chain", TestSubcase::Create<AdvancedPipelineComputeChain>));
	addChild(new TestSubcase(m_context, "pipeline-post-fs", TestSubcase::Create<AdvancedPipelinePostFS>));
	addChild(new TestSubcase(m_context, "pipeline-post-xfb", TestSubcase::Create<AdvancedPipelinePostXFB>));
	addChild(new TestSubcase(m_context, "shared-indexing", TestSubcase::Create<AdvancedSharedIndexing>));
	addChild(new TestSubcase(m_context, "shared-max", TestSubcase::Create<AdvancedSharedMax>));
	addChild(new TestSubcase(m_context, "resources-max", TestSubcase::Create<AdvancedResourcesMax>));
	addChild(new TestSubcase(m_context, "api-no-active-program", TestSubcase::Create<NegativeAPINoActiveProgram>));
	addChild(new TestSubcase(m_context, "api-work-group-count", TestSubcase::Create<NegativeAPIWorkGroupCount>));
	addChild(new TestSubcase(m_context, "api-indirect", TestSubcase::Create<NegativeAPIIndirect>));
	addChild(new TestSubcase(m_context, "api-program", TestSubcase::Create<NegativeAPIProgram>));
	addChild(
		new TestSubcase(m_context, "glsl-compile-time-errors", TestSubcase::Create<NegativeGLSLCompileTimeErrors>));
	addChild(new TestSubcase(m_context, "glsl-link-time-errors", TestSubcase::Create<NegativeGLSLLinkTimeErrors>));
	addChild(new TestSubcase(m_context, "api-attach-shader", TestSubcase::Create<NegativeAttachShader>));
}